

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed.cpp
# Opt level: O0

void __thiscall
iu_TypedTest_x_iutest_x_Equal_Test<short>::Body(iu_TypedTest_x_iutest_x_Equal_Test<short> *this)

{
  bool bVar1;
  char *message;
  type **in_stack_fffffffffffffdd8;
  AssertionHelper local_210;
  Fixed local_1d0;
  char local_44 [4];
  undefined1 local_40 [8];
  AssertionResult iutest_ar;
  TypeParam_conflict1 a;
  iu_TypedTest_x_iutest_x_Equal_Test<short> *this_local;
  
  iutest_ar._38_2_ = 0;
  iutest::detail::AlwaysZero();
  local_44[0] = '\0';
  local_44[1] = '\0';
  local_44[2] = '\0';
  local_44[3] = '\0';
  iutest::internal::backward::EqHelper<true>::Compare<int,short>
            ((AssertionResult *)local_40,(EqHelper<true> *)0x331f12,"a",local_44,
             (int *)&iutest_ar.field_0x26,(short *)&iutest_type_traits::enabler_t<void>::value,
             in_stack_fffffffffffffdd8);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    memset(&local_1d0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1d0);
    message = iutest::AssertionResult::message((AssertionResult *)local_40);
    iutest::AssertionHelper::AssertionHelper
              (&local_210,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/samples/typed.cpp"
               ,0x1e,message,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_210,&local_1d0);
    iutest::AssertionHelper::~AssertionHelper(&local_210);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1d0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  return;
}

Assistant:

IUTEST_TYPED_TEST(TypedTest, Equal)
{
    TypeParam a = 0;
    IUTEST_ASSERT_EQ(0, a);
}